

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

bool __thiscall filesystem::path::exists(path *this)

{
  int iVar1;
  string local_c0;
  stat sb;
  
  str_abi_cxx11_(&local_c0,this,native_path);
  iVar1 = stat(local_c0._M_dataplus._M_p,(stat *)&sb);
  std::__cxx11::string::~string((string *)&local_c0);
  return iVar1 == 0;
}

Assistant:

bool exists() const {
#if defined(_WIN32)
        return GetFileAttributesW(wstr().c_str()) != INVALID_FILE_ATTRIBUTES;
#else
        struct stat sb;
        return stat(str().c_str(), &sb) == 0;
#endif
    }